

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGRadialGradientElement::SVGRadialGradientElement
          (SVGRadialGradientElement *this,Document *document)

{
  SVGGradientElement::SVGGradientElement(&this->super_SVGGradientElement,document,RadialGradient);
  (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGRadialGradientElement_0015a1f0;
  SVGProperty::SVGProperty(&(this->m_cx).super_SVGProperty,Cx);
  (this->m_cx).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_cx).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_cx).super_SVGProperty.field_0xc = 0x42480000;
  (this->m_cx).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_cy).super_SVGProperty,Cy);
  (this->m_cy).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_cy).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_cy).super_SVGProperty.field_0xc = 0x42480000;
  (this->m_cy).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_r).super_SVGProperty,R);
  (this->m_r).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_r).super_SVGProperty.field_0x9 = 0x102;
  *(undefined4 *)&(this->m_r).super_SVGProperty.field_0xc = 0x42480000;
  (this->m_r).field_0x10 = 1;
  SVGProperty::SVGProperty(&(this->m_fx).super_SVGProperty,Fx);
  (this->m_fx).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_fx).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_fx).super_SVGProperty.field_0xc = 0;
  (this->m_fx).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_fy).super_SVGProperty,Fy);
  (this->m_fy).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_fy).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_fy).super_SVGProperty.field_0xc = 0;
  (this->m_fy).field_0x10 = 0;
  SVGElement::addProperty((SVGElement *)this,&(this->m_cx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_r).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_fx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_fy).super_SVGProperty);
  return;
}

Assistant:

SVGRadialGradientElement::SVGRadialGradientElement(Document* document)
    : SVGGradientElement(document, ElementID::RadialGradient)
    , m_cx(PropertyID::Cx, LengthDirection::Horizontal, LengthNegativeMode::Allow, 50.f, LengthUnits::Percent)
    , m_cy(PropertyID::Cy, LengthDirection::Vertical, LengthNegativeMode::Allow, 50.f, LengthUnits::Percent)
    , m_r(PropertyID::R, LengthDirection::Diagonal, LengthNegativeMode::Forbid, 50.f, LengthUnits::Percent)
    , m_fx(PropertyID::Fx, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_fy(PropertyID::Fy, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
{
    addProperty(m_cx);
    addProperty(m_cy);
    addProperty(m_r);
    addProperty(m_fx);
    addProperty(m_fy);
}